

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_dr_prediction_z3_4x8_avx2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *left,int upsample_left,int dy,int bd)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  ushort uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  int iVar66;
  uint uVar67;
  int iVar68;
  undefined1 (*pauVar69) [16];
  long lVar70;
  undefined1 (*pauVar71) [16];
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  int i_2;
  __m128i d [8];
  __m128i dstvec [4];
  __m128i atmp3;
  __m128i atmp2;
  __m128i atmp1;
  __m128i atmp0;
  __m128i mask;
  int i;
  int base;
  __m256i shift;
  __m256i res1;
  __m256i res;
  __m256i b;
  int r;
  int x;
  __m128i a1_x128;
  __m128i a0_x128;
  __m256i mask256;
  __m256i base_inc256;
  __m256i max_base_x256;
  __m256i diff;
  __m256i a_mbase_x;
  __m256i c3f;
  __m256i a16;
  __m256i a32;
  __m256i a1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  int i_1;
  int base_1;
  __m256i shift_1;
  __m256i res1_1;
  __m256i res_1;
  __m256i b_1;
  int r_1;
  int x_1;
  __m256i mask256_1;
  __m256i base_inc256_1;
  __m256i max_base_x256_1;
  __m256i diff_1;
  __m256i a_mbase_x_1;
  __m256i a16_1;
  __m256i a32_1;
  __m256i a1_1;
  __m256i a0_1;
  __m256i a1_2;
  __m256i a0_2;
  int max_base_x_1;
  int frac_bits_1;
  __m128i *in_stack_ffffffffffffe910;
  __m128i *in_stack_ffffffffffffe918;
  uint in_stack_ffffffffffffe928;
  undefined4 in_stack_ffffffffffffe92c;
  uint in_stack_ffffffffffffe930;
  uint in_stack_ffffffffffffe934;
  undefined4 in_stack_ffffffffffffe938;
  undefined4 in_stack_ffffffffffffe93c;
  undefined2 in_stack_ffffffffffffe940;
  ushort in_stack_ffffffffffffe942;
  uint in_stack_ffffffffffffe944;
  int in_stack_ffffffffffffe948;
  undefined2 in_stack_ffffffffffffe94c;
  undefined2 in_stack_ffffffffffffe94e;
  undefined2 in_stack_ffffffffffffe950;
  ushort in_stack_ffffffffffffe952;
  ushort in_stack_ffffffffffffe954;
  undefined1 in_stack_ffffffffffffe956;
  undefined1 in_stack_ffffffffffffe957;
  int local_1694;
  longlong local_1690 [16];
  undefined8 local_1610 [12];
  long local_15b0;
  long local_15a8;
  undefined1 local_1580 [16];
  undefined1 local_1570 [16];
  undefined1 local_1560 [16];
  undefined1 local_1550 [16];
  undefined1 local_1540 [16];
  int local_1528;
  int local_1524;
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  int local_1488;
  uint local_1484;
  undefined1 local_1480 [16];
  undefined1 local_1470 [16];
  undefined1 local_1460 [32];
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined1 local_1400 [32];
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined1 local_13c0 [16];
  undefined1 auStack_13b0 [16];
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined1 local_1380 [32];
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined1 auStack_1350 [16];
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined1 auStack_1330 [16];
  uint local_1308;
  int local_1304;
  byte local_12fc;
  undefined8 *local_12f0;
  undefined4 local_12e4;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  ushort local_124c;
  ushort local_124a;
  undefined2 local_1248;
  ushort local_1246;
  ushort local_1244;
  undefined2 local_1242;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 local_11f0;
  undefined8 uStack_11e8;
  uint8_t local_11e0 [8];
  uint8_t auStack_11d8 [8];
  undefined8 local_11d0;
  undefined8 uStack_11c8;
  uint8_t local_11c0 [8];
  uint8_t auStack_11b8 [8];
  undefined8 local_11b0;
  undefined8 uStack_11a8;
  uint8_t local_11a0 [8];
  uint8_t auStack_1198 [8];
  undefined8 local_1190;
  undefined8 uStack_1188;
  uint8_t local_1180 [8];
  uint8_t auStack_1178 [8];
  undefined8 local_1170;
  undefined8 uStack_1168;
  undefined1 local_1160 [16];
  undefined1 auStack_1150 [16];
  undefined2 local_1140;
  undefined2 local_113e;
  undefined2 local_113c;
  undefined2 local_113a;
  undefined2 local_1138;
  undefined2 local_1136;
  undefined2 local_1134;
  undefined2 local_1132;
  undefined2 local_1130;
  undefined2 local_112e;
  undefined2 local_112c;
  undefined2 local_112a;
  undefined2 local_1128;
  undefined2 local_1126;
  undefined2 local_1124;
  undefined2 local_1122;
  undefined1 local_1120 [16];
  undefined1 auStack_1110 [16];
  ushort local_1100;
  ushort local_10fe;
  ushort local_10fc;
  ushort local_10fa;
  ushort local_10f8;
  ushort local_10f6;
  ushort local_10f4;
  ushort local_10f2;
  ushort local_10f0;
  ushort local_10ee;
  ushort local_10ec;
  ushort local_10ea;
  ushort local_10e8;
  ushort local_10e6;
  ushort local_10e4;
  ushort local_10e2;
  undefined1 local_10e0 [16];
  undefined1 auStack_10d0 [16];
  ushort local_10c0;
  ushort local_10be;
  ushort local_10bc;
  ushort local_10ba;
  ushort local_10b8;
  ushort local_10b6;
  ushort local_10b4;
  ushort local_10b2;
  ushort local_10b0;
  ushort local_10ae;
  ushort local_10ac;
  ushort local_10aa;
  ushort local_10a8;
  ushort local_10a6;
  ushort local_10a4;
  ushort local_10a2;
  undefined1 local_10a0 [32];
  undefined2 local_1080;
  undefined2 local_107e;
  undefined2 local_107c;
  undefined2 local_107a;
  undefined2 local_1078;
  undefined2 local_1076;
  undefined2 local_1074;
  undefined2 local_1072;
  undefined2 local_1070;
  undefined2 local_106e;
  undefined2 local_106c;
  undefined2 local_106a;
  undefined2 local_1068;
  undefined2 local_1066;
  undefined2 local_1064;
  undefined2 local_1062;
  undefined1 local_1060 [32];
  ushort local_1040;
  ushort local_103e;
  ushort local_103c;
  ushort local_103a;
  ushort local_1038;
  ushort local_1036;
  ushort local_1034;
  ushort local_1032;
  ushort local_1030;
  ushort local_102e;
  ushort local_102c;
  ushort local_102a;
  ushort local_1028;
  ushort local_1026;
  ushort local_1024;
  ushort local_1022;
  undefined1 local_1020 [32];
  ushort local_1000;
  ushort local_ffe;
  ushort local_ffc;
  ushort local_ffa;
  ushort local_ff8;
  ushort local_ff6;
  ushort local_ff4;
  ushort local_ff2;
  ushort local_ff0;
  ushort local_fee;
  ushort local_fec;
  ushort local_fea;
  ushort local_fe8;
  ushort local_fe6;
  ushort local_fe4;
  ushort local_fe2;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined1 local_f60 [16];
  undefined1 auStack_f50 [16];
  undefined1 local_f40 [16];
  undefined1 auStack_f30 [16];
  undefined1 local_f20 [16];
  undefined1 auStack_f10 [16];
  undefined1 local_f00 [32];
  undefined1 (*local_ee0) [16];
  undefined1 (*local_ed8) [16];
  undefined1 (*local_ed0) [16];
  undefined4 local_ec4;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined4 local_e84;
  undefined1 local_e80 [32];
  undefined4 local_e44;
  undefined1 local_e40 [32];
  undefined4 local_e04;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined1 local_dc0 [16];
  undefined1 auStack_db0 [16];
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 local_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 local_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  int local_ce8;
  uint local_ce4;
  undefined1 local_ce0 [32];
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  undefined1 local_c80 [32];
  int local_c48;
  uint local_c44;
  undefined1 local_c40 [32];
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined1 local_c00 [16];
  undefined1 auStack_bf0 [16];
  undefined1 local_be0 [32];
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined1 local_b80 [32];
  undefined1 auStack_b50 [16];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [24];
  undefined8 uStack_ae8;
  uint local_ac8;
  int local_ac4;
  undefined8 *local_ab0;
  undefined4 local_aa8;
  ushort local_aa2;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined1 local_9e0 [16];
  undefined1 auStack_9d0 [16];
  ushort local_9c0;
  ushort local_9be;
  ushort local_9bc;
  ushort local_9ba;
  ushort local_9b8;
  ushort local_9b6;
  ushort local_9b4;
  ushort local_9b2;
  ushort local_9b0;
  ushort local_9ae;
  ushort local_9ac;
  ushort local_9aa;
  ushort local_9a8;
  ushort local_9a6;
  ushort local_9a4;
  ushort local_9a2;
  undefined1 local_9a0 [16];
  undefined1 auStack_990 [16];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined1 local_960 [16];
  undefined1 auStack_950 [16];
  undefined1 local_940 [32];
  undefined1 (*local_920) [16];
  undefined1 (*local_918) [16];
  undefined1 (*local_910) [16];
  undefined4 local_908;
  uint local_904;
  undefined4 local_900;
  uint local_8fc;
  uint local_8f8;
  undefined4 local_8f4;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined1 local_840 [16];
  undefined1 auStack_830 [16];
  undefined4 local_820;
  undefined4 local_81c;
  undefined4 local_818;
  undefined4 local_814;
  undefined4 local_810;
  undefined4 local_80c;
  undefined4 local_808;
  undefined4 local_804;
  undefined1 local_800 [32];
  uint local_7e0;
  uint local_7dc;
  uint local_7d8;
  uint local_7d4;
  uint local_7d0;
  uint local_7cc;
  uint local_7c8;
  uint local_7c4;
  undefined1 local_7c0 [16];
  undefined1 auStack_7b0 [16];
  uint local_7a0;
  uint local_79c;
  uint local_798;
  uint local_794;
  uint local_790;
  uint local_78c;
  uint local_788;
  uint local_784;
  undefined1 local_780 [32];
  undefined4 local_760;
  undefined4 local_75c;
  undefined4 local_758;
  undefined4 local_754;
  undefined4 local_750;
  undefined4 local_74c;
  undefined4 local_748;
  undefined4 local_744;
  undefined1 local_740 [16];
  undefined1 auStack_730 [16];
  uint local_720;
  uint local_71c;
  uint local_718;
  uint local_714;
  uint local_710;
  uint local_70c;
  uint local_708;
  uint local_704;
  undefined1 local_700 [32];
  undefined4 local_6e0;
  undefined4 local_6dc;
  undefined4 local_6d8;
  undefined4 local_6d4;
  undefined4 local_6d0;
  undefined4 local_6cc;
  undefined4 local_6c8;
  undefined4 local_6c4;
  undefined1 local_6c0 [16];
  undefined1 auStack_6b0 [16];
  undefined4 local_6a0;
  undefined4 local_69c;
  undefined4 local_698;
  undefined4 local_694;
  undefined4 local_690;
  undefined4 local_68c;
  undefined4 local_688;
  undefined4 local_684;
  undefined1 local_680 [16];
  undefined1 auStack_670 [16];
  undefined4 local_644;
  undefined4 local_640;
  undefined4 local_63c;
  undefined4 local_638;
  undefined4 local_634;
  undefined4 local_630;
  undefined4 local_62c;
  undefined4 local_628;
  undefined4 local_624;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined4 local_5e4;
  undefined1 local_5e0 [32];
  undefined4 local_5a4;
  undefined1 local_5a0 [32];
  undefined4 local_564;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  uint8_t local_3e0 [8];
  uint8_t auStack_3d8 [8];
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  uint8_t local_3c0 [8];
  uint8_t auStack_3b8 [22];
  undefined1 local_3a2;
  undefined1 local_3a1;
  undefined2 local_3a0;
  undefined2 local_39e;
  undefined2 local_39c;
  undefined2 local_39a;
  undefined2 local_398;
  undefined2 local_396;
  undefined2 local_394;
  undefined2 local_392;
  ushort local_390;
  ushort local_38e;
  ushort local_38c;
  ushort local_38a;
  ushort local_388;
  ushort local_386;
  ushort local_384;
  ushort local_382;
  undefined1 local_380 [16];
  undefined1 auStack_370 [16];
  ushort local_360;
  ushort local_35e;
  ushort local_35c;
  ushort local_35a;
  ushort local_358;
  ushort local_356;
  ushort local_354;
  ushort local_352;
  undefined2 local_350;
  undefined2 local_34e;
  undefined2 local_34c;
  undefined2 local_34a;
  undefined2 local_348;
  undefined2 local_346;
  undefined2 local_344;
  undefined2 local_342;
  undefined2 local_340;
  undefined2 local_33e;
  undefined2 local_33c;
  undefined2 local_33a;
  undefined2 local_338;
  undefined2 local_336;
  undefined2 local_334;
  undefined2 local_332;
  ushort local_330;
  ushort local_32e;
  ushort local_32c;
  ushort local_32a;
  ushort local_328;
  ushort local_326;
  ushort local_324;
  ushort local_322;
  undefined1 local_320 [16];
  undefined1 auStack_310 [16];
  ushort local_300;
  ushort local_2fe;
  ushort local_2fc;
  ushort local_2fa;
  ushort local_2f8;
  ushort local_2f6;
  ushort local_2f4;
  ushort local_2f2;
  undefined2 local_2f0;
  undefined2 local_2ee;
  undefined2 local_2ec;
  undefined2 local_2ea;
  undefined2 local_2e8;
  undefined2 local_2e6;
  undefined2 local_2e4;
  undefined2 local_2e2;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [16];
  undefined1 local_210;
  undefined1 local_20f;
  undefined1 local_20e;
  undefined1 local_20d;
  undefined1 local_20c;
  undefined1 local_20b;
  undefined1 local_20a;
  undefined1 local_209;
  undefined1 local_208;
  undefined1 local_207;
  undefined1 local_206;
  undefined1 local_205;
  undefined1 local_204;
  undefined1 local_203;
  undefined1 local_202;
  undefined1 local_201;
  undefined1 local_200 [16];
  undefined1 local_1f0;
  undefined1 local_1ef;
  undefined1 local_1ee;
  undefined1 local_1ed;
  undefined1 local_1ec;
  undefined1 local_1eb;
  undefined1 local_1ea;
  undefined1 local_1e9;
  undefined1 local_1e8;
  undefined1 local_1e7;
  undefined1 local_1e6;
  undefined1 local_1e5;
  undefined1 local_1e4;
  undefined1 local_1e3;
  undefined1 local_1e2;
  undefined1 local_1e1;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  uint local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  uint local_1c4;
  undefined1 local_1c0 [16];
  undefined1 auStack_1b0 [16];
  uint local_1a0;
  int local_19c;
  int local_198;
  int local_194;
  uint local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  uint local_174;
  int local_170;
  int local_16c;
  int local_168;
  uint local_164;
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  uint local_140;
  int local_13c;
  int local_138;
  int local_134;
  uint local_130;
  int local_12c;
  int local_128;
  int local_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined1 auStack_110 [16];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [16];
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 auStack_90 [16];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar65._8_8_ = auStack_f50._8_8_;
  auVar65._0_8_ = auStack_f50._0_8_;
  auVar64._8_8_ = local_f60._8_8_;
  auVar64._0_8_ = local_f60._0_8_;
  auVar63._8_8_ = auStack_f10._8_8_;
  auVar63._0_8_ = auStack_f10._0_8_;
  auVar62._8_8_ = local_f20._8_8_;
  auVar62._0_8_ = local_f20._0_8_;
  auVar77._24_8_ = auStack_950._8_8_;
  auVar77._16_8_ = auStack_950._0_8_;
  auVar77._8_8_ = local_960._8_8_;
  auVar77._0_8_ = local_960._0_8_;
  auVar78._24_8_ = auStack_990._8_8_;
  auVar78._16_8_ = auStack_990._0_8_;
  auVar78._8_8_ = local_9a0._8_8_;
  auVar78._0_8_ = local_9a0._0_8_;
  auVar75._24_8_ = auStack_bf0._8_8_;
  auVar75._16_8_ = auStack_bf0._0_8_;
  auVar75._8_8_ = local_c00._8_8_;
  auVar75._0_8_ = local_c00._0_8_;
  auVar73._24_8_ = auStack_db0._8_8_;
  auVar73._16_8_ = auStack_db0._0_8_;
  auVar73._8_8_ = local_dc0._8_8_;
  auVar73._0_8_ = local_dc0._0_8_;
  auVar74._24_8_ = auStack_f30._8_8_;
  auVar74._16_8_ = auStack_f30._0_8_;
  auVar74._8_8_ = local_f40._8_8_;
  auVar74._0_8_ = local_f40._0_8_;
  auVar72._24_8_ = auStack_13b0._8_8_;
  auVar72._16_8_ = auStack_13b0._0_8_;
  auVar72._8_8_ = local_13c0._8_8_;
  auVar72._0_8_ = local_13c0._0_8_;
  local_12fc = (byte)in_ECX;
  if (in_R9D < 0xc) {
    local_12e4 = 4;
    iVar66 = 6 - in_ECX;
    uVar67 = 0xb << (local_12fc & 0x1f);
    local_1242 = 0x10;
    local_1122 = 0x10;
    local_1124 = 0x10;
    local_1126 = 0x10;
    local_1128 = 0x10;
    local_112a = 0x10;
    local_112c = 0x10;
    local_112e = 0x10;
    local_1130 = 0x10;
    local_1132 = 0x10;
    local_1134 = 0x10;
    local_1136 = 0x10;
    local_1138 = 0x10;
    local_113a = 0x10;
    local_113c = 0x10;
    local_113e = 0x10;
    local_1140 = 0x10;
    auVar72._0_16_ = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x10,2);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x10,3);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x10,4);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x10,5);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x10,6);
    auVar3 = vpinsrw_avx(auVar72._0_16_,0x10,7);
    auVar72._0_16_ = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x10,2);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x10,3);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x10,4);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x10,5);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x10,6);
    auVar4 = vpinsrw_avx(auVar72._0_16_,0x10,7);
    local_1160._0_8_ = auVar3._0_8_;
    local_1160._8_8_ = auVar3._8_8_;
    auStack_1150._0_8_ = auVar4._0_8_;
    auStack_1150._8_8_ = auVar4._8_8_;
    local_13a0 = local_1160._0_8_;
    uStack_1398 = local_1160._8_8_;
    uStack_1390 = auStack_1150._0_8_;
    uStack_1388 = auStack_1150._8_8_;
    uVar1 = *(ushort *)(in_RDX + (long)(int)uVar67 * 2);
    auVar72._0_16_ = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,(uint)uVar1,2);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,(uint)uVar1,3);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,(uint)uVar1,4);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,(uint)uVar1,5);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,(uint)uVar1,6);
    auVar5 = vpinsrw_avx(auVar72._0_16_,(uint)uVar1,7);
    auVar72._0_16_ = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,(uint)uVar1,2);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,(uint)uVar1,3);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,(uint)uVar1,4);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,(uint)uVar1,5);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,(uint)uVar1,6);
    auVar6 = vpinsrw_avx(auVar72._0_16_,(uint)uVar1,7);
    local_1120._0_8_ = auVar5._0_8_;
    local_1120._8_8_ = auVar5._8_8_;
    auStack_1110._0_8_ = auVar6._0_8_;
    auStack_1110._8_8_ = auVar6._8_8_;
    local_13e0 = local_1120._0_8_;
    uStack_13d8 = local_1120._8_8_;
    uStack_13d0 = auStack_1110._0_8_;
    uStack_13c8 = auStack_1110._8_8_;
    local_1308._0_2_ = (ushort)uVar67;
    local_1246 = (ushort)local_1308;
    local_10a2 = (ushort)local_1308;
    local_10a4 = (ushort)local_1308;
    local_10a6 = (ushort)local_1308;
    local_10a8 = (ushort)local_1308;
    local_10aa = (ushort)local_1308;
    local_10ac = (ushort)local_1308;
    local_10ae = (ushort)local_1308;
    local_10b0 = (ushort)local_1308;
    local_10b2 = (ushort)local_1308;
    local_10b4 = (ushort)local_1308;
    local_10b6 = (ushort)local_1308;
    local_10b8 = (ushort)local_1308;
    local_10ba = (ushort)local_1308;
    local_10bc = (ushort)local_1308;
    local_10be = (ushort)local_1308;
    local_10c0 = (ushort)local_1308;
    auVar72._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1308),uVar67 & 0xffff,1);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,uVar67 & 0xffff,2);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,uVar67 & 0xffff,3);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,uVar67 & 0xffff,4);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,uVar67 & 0xffff,5);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,uVar67 & 0xffff,6);
    auVar7 = vpinsrw_avx(auVar72._0_16_,uVar67 & 0xffff,7);
    auVar72._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1308),uVar67 & 0xffff,1);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,uVar67 & 0xffff,2);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,uVar67 & 0xffff,3);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,uVar67 & 0xffff,4);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,uVar67 & 0xffff,5);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,uVar67 & 0xffff,6);
    auVar8 = vpinsrw_avx(auVar72._0_16_,uVar67 & 0xffff,7);
    local_10e0._0_8_ = auVar7._0_8_;
    local_10e0._8_8_ = auVar7._8_8_;
    auStack_10d0._0_8_ = auVar8._0_8_;
    auStack_10d0._8_8_ = auVar8._8_8_;
    local_1420 = local_10e0._0_8_;
    uStack_1418 = local_10e0._8_8_;
    uStack_1410 = auStack_10d0._0_8_;
    uStack_1408 = auStack_10d0._8_8_;
    local_1248 = 0x3f;
    local_1062 = 0x3f;
    local_1064 = 0x3f;
    local_1066 = 0x3f;
    local_1068 = 0x3f;
    local_106a = 0x3f;
    local_106c = 0x3f;
    local_106e = 0x3f;
    local_1070 = 0x3f;
    local_1072 = 0x3f;
    local_1074 = 0x3f;
    local_1076 = 0x3f;
    local_1078 = 0x3f;
    local_107a = 0x3f;
    local_107c = 0x3f;
    local_107e = 0x3f;
    local_1080 = 0x3f;
    auVar72._0_16_ = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,2);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,3);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,4);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,5);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,6);
    auVar72._16_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,7);
    auVar72._0_16_ = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,2);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,3);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,4);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,5);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,6);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,7);
    auVar72._0_16_ = ZEXT116(0) * auVar72._16_16_ + ZEXT116(1) * auVar72._0_16_;
    auVar72._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar72._16_16_;
    local_10a0._16_8_ = auVar72._16_8_;
    local_10a0._24_8_ = auVar72._24_8_;
    local_1484 = in_R8D;
    for (local_1488 = 0; local_1308 = uVar67, local_1304 = iVar66, local_12f0 = local_1610,
        local_1244 = uVar1, local_1100 = uVar1, local_10fe = uVar1, local_10fc = uVar1,
        local_10fa = uVar1, local_10f8 = uVar1, local_10f6 = uVar1, local_10f4 = uVar1,
        local_10f2 = uVar1, local_10f0 = uVar1, local_10ee = uVar1, local_10ec = uVar1,
        local_10ea = uVar1, local_10e8 = uVar1, local_10e6 = uVar1, local_10e4 = uVar1,
        local_10e2 = uVar1, auVar14 = auVar72, auVar10 = auStack_9d0, auVar79 = local_840,
        auVar2 = auStack_830, auVar11 = local_800, local_1488 < 4; local_1488 = local_1488 + 1) {
      iVar68 = (int)local_1484 >> ((byte)iVar66 & 0x1f);
      local_1524 = iVar68;
      if ((int)uVar67 <= iVar68) {
        for (local_1528 = local_1488; local_1528 < 4; local_1528 = local_1528 + 1) {
          local_1610[(long)local_1528 * 2] = local_1120._0_8_;
          local_1610[(long)local_1528 * 2 + 1] = local_1120._8_8_;
          local_1220 = local_1120._0_8_;
          uStack_1218 = local_1120._8_8_;
          uStack_1210 = auStack_1110._0_8_;
          uStack_1208 = auStack_1110._8_8_;
        }
        break;
      }
      pauVar69 = (undefined1 (*) [16])(in_RDX + (long)iVar68 * 2);
      local_1470 = *pauVar69;
      uVar17 = (ushort)iVar68;
      if (in_ECX == 0) {
        local_ee0 = (undefined1 (*) [16])(in_RDX + 2 + (long)iVar68 * 2);
        local_1480 = *local_ee0;
        local_324 = uVar17 + 1;
        local_326 = uVar17 + 2;
        local_328 = uVar17 + 3;
        local_32a = uVar17 + 4;
        local_32c = uVar17 + 5;
        local_32e = uVar17 + 6;
        local_330 = uVar17 + 7;
        local_332 = 0;
        local_334 = 0;
        local_336 = 0;
        local_338 = 0;
        local_33a = 0;
        local_33c = 0;
        local_33e = 0;
        local_340 = 0;
        in_stack_ffffffffffffe94e = 0;
        in_stack_ffffffffffffe950 = 0;
        local_2e2 = 0;
        local_2e4 = 0;
        local_2e6 = 0;
        local_2e8 = 0;
        local_2ea = 0;
        local_2ec = 0;
        local_2ee = 0;
        local_2f0 = 0;
        auVar74._0_16_ = vpinsrw_avx(ZEXT216(uVar17),(uint)local_324,1);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,(uint)local_326,2);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,(uint)local_328,3);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,(uint)local_32a,4);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,(uint)local_32c,5);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,(uint)local_32e,6);
        local_320 = vpinsrw_avx(auVar74._0_16_,(uint)local_330,7);
        auVar74._0_16_ = vpinsrw_avx(ZEXT216(0),0,1);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,0,2);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,0,3);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,0,4);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,0,5);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,0,6);
        auStack_310 = vpinsrw_avx(auVar74._0_16_,0,7);
        local_1440 = local_320._0_8_;
        uStack_1438 = local_320._8_8_;
        uStack_1430 = auStack_310._0_8_;
        uStack_1428 = auStack_310._8_8_;
        local_124c = (ushort)local_1484;
        local_fe2 = (ushort)local_1484;
        local_fe4 = (ushort)local_1484;
        local_fe6 = (ushort)local_1484;
        local_fe8 = (ushort)local_1484;
        local_fea = (ushort)local_1484;
        local_fec = (ushort)local_1484;
        local_fee = (ushort)local_1484;
        local_ff0 = (ushort)local_1484;
        local_ff2 = (ushort)local_1484;
        local_ff4 = (ushort)local_1484;
        local_ff6 = (ushort)local_1484;
        local_ff8 = (ushort)local_1484;
        local_ffa = (ushort)local_1484;
        local_ffc = (ushort)local_1484;
        local_ffe = (ushort)local_1484;
        local_1000 = (ushort)local_1484;
        auVar74._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1484),local_1484 & 0xffff,1);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_1484 & 0xffff,2);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_1484 & 0xffff,3);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_1484 & 0xffff,4);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_1484 & 0xffff,5);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_1484 & 0xffff,6);
        auVar74._16_16_ = vpinsrw_avx(auVar74._0_16_,local_1484 & 0xffff,7);
        auVar74._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1484),local_1484 & 0xffff,1);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_1484 & 0xffff,2);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_1484 & 0xffff,3);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_1484 & 0xffff,4);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_1484 & 0xffff,5);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_1484 & 0xffff,6);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_1484 & 0xffff,7);
        auVar74._0_16_ = ZEXT116(0) * auVar74._16_16_ + ZEXT116(1) * auVar74._0_16_;
        auVar74._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar74._16_16_;
        local_1020._16_8_ = auVar74._16_8_;
        local_1020._24_8_ = auVar74._24_8_;
        auVar49._16_8_ = local_1020._16_8_;
        auVar49._0_16_ = auVar74._0_16_;
        auVar49._24_8_ = local_1020._24_8_;
        auVar48._16_8_ = local_10a0._16_8_;
        auVar48._0_16_ = auVar72._0_16_;
        auVar48._24_8_ = local_10a0._24_8_;
        local_e80 = vpand_avx2(auVar49,auVar48);
        local_e84 = 1;
        local_1520 = vpsrlw_avx2(local_e80,ZEXT416(1));
        in_stack_ffffffffffffe948 = iVar68;
        in_stack_ffffffffffffe952 = uVar17;
        in_stack_ffffffffffffe954 = (ushort)local_1484;
        local_1020 = auVar74;
        local_322 = uVar17;
        local_300 = uVar17;
        local_2fe = local_324;
        local_2fc = local_326;
        local_2fa = local_328;
        local_2f8 = local_32a;
        local_2f6 = local_32c;
        local_2f4 = local_32e;
        local_2f2 = local_330;
        auVar64 = auVar72._0_16_;
        auVar65 = auVar72._16_16_;
      }
      else {
        local_ed8 = (undefined1 (*) [16])(in_RDX + 0x10 + (long)iVar68 * 2);
        local_11d0 = *(undefined8 *)*local_ed8;
        uStack_11c8 = *(undefined8 *)(*local_ed8 + 8);
        local_1180 = (uint8_t  [8])HighbdEvenOddMaskx[0]._0_8_;
        auStack_1178 = (uint8_t  [8])HighbdEvenOddMaskx[0]._8_8_;
        auVar10._8_8_ = HighbdEvenOddMaskx[0]._8_8_;
        auVar10._0_8_ = HighbdEvenOddMaskx[0]._0_8_;
        local_1550 = vpshufb_avx(*pauVar69,auVar10);
        local_11a0 = (uint8_t  [8])HighbdEvenOddMaskx[0]._0_8_;
        auStack_1198 = (uint8_t  [8])HighbdEvenOddMaskx[0]._8_8_;
        auVar9._8_8_ = HighbdEvenOddMaskx[0]._8_8_;
        auVar9._0_8_ = HighbdEvenOddMaskx[0]._0_8_;
        local_1560 = vpshufb_avx(*local_ed8,auVar9);
        local_11c0 = (uint8_t  [8])HighbdEvenOddMaskx[0]._16_8_;
        auStack_11b8 = (uint8_t  [8])HighbdEvenOddMaskx[0]._24_8_;
        auVar2._8_8_ = HighbdEvenOddMaskx[0]._24_8_;
        auVar2._0_8_ = HighbdEvenOddMaskx[0]._16_8_;
        local_1570 = vpshufb_avx(*pauVar69,auVar2);
        local_11e0 = (uint8_t  [8])HighbdEvenOddMaskx[0]._16_8_;
        auStack_11d8 = (uint8_t  [8])HighbdEvenOddMaskx[0]._24_8_;
        auVar79._8_8_ = HighbdEvenOddMaskx[0]._24_8_;
        auVar79._0_8_ = HighbdEvenOddMaskx[0]._16_8_;
        local_1580 = vpshufb_avx(*local_ed8,auVar79);
        local_3a1 = 0xf;
        in_stack_ffffffffffffe956 = 0xf;
        local_201 = 0xf;
        local_202 = 0xf;
        local_203 = 0xf;
        local_204 = 0xf;
        local_205 = 0xf;
        local_206 = 0xf;
        local_207 = 0xf;
        local_208 = 0xf;
        local_209 = 0xf;
        local_20a = 0xf;
        local_20b = 0xf;
        local_20c = 0xf;
        local_20d = 0xf;
        local_20e = 0xf;
        local_20f = 0xf;
        local_210 = 0xf;
        auVar73._0_16_ = vpinsrb_avx(ZEXT116(0xf),0xf,1);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,2);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,3);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,4);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,5);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,6);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,7);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,8);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,9);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,10);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,0xb);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,0xc);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,0xd);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,0xe);
        local_220 = vpinsrb_avx(auVar73._0_16_,0xf,0xf);
        local_3c0 = (uint8_t  [8])HighbdEvenOddMaskx[0]._0_8_;
        auStack_3b8._0_8_ = HighbdEvenOddMaskx[0]._8_8_;
        local_3d0 = local_220._0_8_;
        uStack_3c8 = local_220._8_8_;
        auVar55._8_8_ = HighbdEvenOddMaskx[0]._8_8_;
        auVar55._0_8_ = HighbdEvenOddMaskx[0]._0_8_;
        auVar73._0_16_ = vpcmpgtb_avx(auVar55,local_220);
        local_1540._0_8_ = auVar73._0_8_;
        local_1540._8_8_ = auVar73._8_8_;
        local_d00 = local_1550._0_8_;
        uStack_cf8 = local_1550._8_8_;
        local_d10 = local_1560._0_8_;
        uStack_d08 = local_1560._8_8_;
        local_d20 = local_1540._0_8_;
        uStack_d18 = local_1540._8_8_;
        local_1470 = vpblendvb_avx(local_1550,local_1560,auVar73._0_16_);
        local_3a2 = 0xf;
        in_stack_ffffffffffffe957 = 0xf;
        local_1e1 = 0xf;
        local_1e2 = 0xf;
        local_1e3 = 0xf;
        local_1e4 = 0xf;
        local_1e5 = 0xf;
        local_1e6 = 0xf;
        local_1e7 = 0xf;
        local_1e8 = 0xf;
        local_1e9 = 0xf;
        local_1ea = 0xf;
        local_1eb = 0xf;
        local_1ec = 0xf;
        local_1ed = 0xf;
        local_1ee = 0xf;
        local_1ef = 0xf;
        local_1f0 = 0xf;
        auVar73._0_16_ = vpinsrb_avx(ZEXT116(0xf),0xf,1);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,2);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,3);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,4);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,5);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,6);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,7);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,8);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,9);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,10);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,0xb);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,0xc);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,0xd);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,0xe);
        local_200 = vpinsrb_avx(auVar73._0_16_,0xf,0xf);
        local_3e0 = (uint8_t  [8])HighbdEvenOddMaskx[0]._16_8_;
        auStack_3d8 = (uint8_t  [8])HighbdEvenOddMaskx[0]._24_8_;
        local_3f0 = local_200._0_8_;
        uStack_3e8 = local_200._8_8_;
        auVar54._8_8_ = HighbdEvenOddMaskx[0]._24_8_;
        auVar54._0_8_ = HighbdEvenOddMaskx[0]._16_8_;
        local_1540 = vpcmpgtb_avx(auVar54,local_200);
        local_d30 = local_1570._0_8_;
        uStack_d28 = local_1570._8_8_;
        local_d40 = local_1580._0_8_;
        uStack_d38 = local_1580._8_8_;
        local_d50 = local_1540._0_8_;
        uStack_d48 = local_1540._8_8_;
        local_1480 = vpblendvb_avx(local_1570,local_1580,local_1540);
        local_384 = uVar17 + 2;
        local_386 = uVar17 + 4;
        local_388 = uVar17 + 6;
        local_38a = uVar17 + 8;
        local_38c = uVar17 + 10;
        local_38e = uVar17 + 0xc;
        local_390 = uVar17 + 0xe;
        local_392 = 0;
        local_394 = 0;
        local_396 = 0;
        local_398 = 0;
        local_39a = 0;
        local_39c = 0;
        local_39e = 0;
        local_3a0 = 0;
        local_342 = 0;
        local_344 = 0;
        local_346 = 0;
        local_348 = 0;
        local_34a = 0;
        local_34c = 0;
        local_34e = 0;
        local_350 = 0;
        auVar73._0_16_ = vpinsrw_avx(ZEXT216(uVar17),(uint)local_384,1);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,(uint)local_386,2);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,(uint)local_388,3);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,(uint)local_38a,4);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,(uint)local_38c,5);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,(uint)local_38e,6);
        local_380 = vpinsrw_avx(auVar73._0_16_,(uint)local_390,7);
        auVar73._0_16_ = vpinsrw_avx(ZEXT216(0),0,1);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0,2);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0,3);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0,4);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0,5);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0,6);
        auStack_370 = vpinsrw_avx(auVar73._0_16_,0,7);
        local_1440 = local_380._0_8_;
        uStack_1438 = local_380._8_8_;
        uStack_1430 = auStack_370._0_8_;
        uStack_1428 = auStack_370._8_8_;
        local_124a = (ushort)local_1484;
        local_1022 = (ushort)local_1484;
        local_1024 = (ushort)local_1484;
        local_1026 = (ushort)local_1484;
        local_1028 = (ushort)local_1484;
        local_102a = (ushort)local_1484;
        local_102c = (ushort)local_1484;
        local_102e = (ushort)local_1484;
        local_1030 = (ushort)local_1484;
        local_1032 = (ushort)local_1484;
        local_1034 = (ushort)local_1484;
        local_1036 = (ushort)local_1484;
        local_1038 = (ushort)local_1484;
        local_103a = (ushort)local_1484;
        local_103c = (ushort)local_1484;
        local_103e = (ushort)local_1484;
        local_1040 = (ushort)local_1484;
        auVar73._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1484),local_1484 & 0xffff,1);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,local_1484 & 0xffff,2);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,local_1484 & 0xffff,3);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,local_1484 & 0xffff,4);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,local_1484 & 0xffff,5);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,local_1484 & 0xffff,6);
        auVar73._16_16_ = vpinsrw_avx(auVar73._0_16_,local_1484 & 0xffff,7);
        auVar73._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1484),local_1484 & 0xffff,1);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,local_1484 & 0xffff,2);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,local_1484 & 0xffff,3);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,local_1484 & 0xffff,4);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,local_1484 & 0xffff,5);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,local_1484 & 0xffff,6);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,local_1484 & 0xffff,7);
        auVar73._0_16_ = ZEXT116(0) * auVar73._16_16_ + ZEXT116(1) * auVar73._0_16_;
        auVar73._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar73._16_16_;
        local_1060._16_8_ = auVar73._16_8_;
        local_1060._24_8_ = auVar73._24_8_;
        auVar52._16_8_ = local_1060._16_8_;
        auVar52._0_16_ = auVar73._0_16_;
        auVar52._24_8_ = local_1060._24_8_;
        local_f00 = vpsllw_avx2(auVar52,ZEXT416(in_ECX));
        auVar50._16_8_ = local_10a0._16_8_;
        auVar50._0_16_ = auVar72._0_16_;
        auVar50._24_8_ = local_10a0._24_8_;
        local_e40 = vpand_avx2(local_f00,auVar50);
        local_e44 = 1;
        local_1520 = vpsrlw_avx2(local_e40,ZEXT416(1));
        local_11b0 = *(undefined8 *)*pauVar69;
        uStack_11a8 = *(undefined8 *)(*pauVar69 + 8);
        local_1190 = local_11d0;
        uStack_1188 = uStack_11c8;
        local_1170 = *(undefined8 *)*pauVar69;
        uStack_1168 = *(undefined8 *)(*pauVar69 + 8);
        local_1060 = auVar73;
        local_382 = uVar17;
        local_360 = uVar17;
        local_35e = local_384;
        local_35c = local_386;
        local_35a = local_388;
        local_358 = local_38a;
        local_356 = local_38c;
        local_354 = local_38e;
        local_352 = local_390;
        auVar62 = auVar72._0_16_;
        auVar63 = auVar72._16_16_;
      }
      auVar79 = ZEXT416(1);
      auStack_1350._0_8_ = auVar79._0_8_;
      uVar26 = auStack_1350._0_8_;
      auVar45._16_8_ = auStack_1350._0_8_;
      auVar45._0_16_ = local_1480;
      auVar45._24_8_ = 0;
      auVar44._16_8_ = auStack_1350._0_8_;
      auVar44._0_16_ = local_1470;
      auVar44._24_8_ = 0;
      auVar16 = vpsubw_avx2(auVar45,auVar44);
      local_e04 = 5;
      auVar51._16_8_ = auStack_1350._0_8_;
      auVar51._0_16_ = local_1470;
      auVar51._24_8_ = 0;
      auVar14 = vpsllw_avx2(auVar51,ZEXT416(5));
      local_1380._0_8_ = auVar14._0_8_;
      uVar27 = local_1380._0_8_;
      local_1380._8_8_ = auVar14._8_8_;
      uVar18 = local_1380._8_8_;
      local_1380._16_8_ = auVar14._16_8_;
      uVar19 = local_1380._16_8_;
      local_1380._24_8_ = auVar14._24_8_;
      uVar20 = local_1380._24_8_;
      auVar43._16_8_ = auStack_1150._0_8_;
      auVar43._0_16_ = auVar3;
      auVar43._24_8_ = auStack_1150._8_8_;
      auVar14 = vpaddw_avx2(auVar14,auVar43);
      local_1400._0_8_ = auVar16._0_8_;
      uVar21 = local_1400._0_8_;
      local_1400._8_8_ = auVar16._8_8_;
      uVar22 = local_1400._8_8_;
      local_1400._16_8_ = auVar16._16_8_;
      uVar23 = local_1400._16_8_;
      local_1400._24_8_ = auVar16._24_8_;
      uVar24 = local_1400._24_8_;
      auVar13 = vpmullw_avx2(auVar16,local_1520);
      local_1380._0_8_ = auVar14._0_8_;
      uVar25 = local_1380._0_8_;
      local_1380._8_8_ = auVar14._8_8_;
      uVar28 = local_1380._8_8_;
      local_1380._16_8_ = auVar14._16_8_;
      uVar29 = local_1380._16_8_;
      local_1380._24_8_ = auVar14._24_8_;
      uVar30 = local_1380._24_8_;
      local_14c0._0_8_ = auVar13._0_8_;
      uVar31 = local_14c0._0_8_;
      local_14c0._8_8_ = auVar13._8_8_;
      uVar32 = local_14c0._8_8_;
      local_14c0._16_8_ = auVar13._16_8_;
      uVar33 = local_14c0._16_8_;
      local_14c0._24_8_ = auVar13._24_8_;
      uVar34 = local_14c0._24_8_;
      auVar11 = vpaddw_avx2(auVar14,auVar13);
      local_14e0._0_8_ = auVar11._0_8_;
      uVar35 = local_14e0._0_8_;
      local_14e0._8_8_ = auVar11._8_8_;
      uVar36 = local_14e0._8_8_;
      local_14e0._16_8_ = auVar11._16_8_;
      uVar37 = local_14e0._16_8_;
      local_14e0._24_8_ = auVar11._24_8_;
      uVar38 = local_14e0._24_8_;
      local_ec4 = 5;
      auVar15 = vpsrlw_avx2(auVar11,ZEXT416(5));
      auVar47._16_8_ = auStack_10d0._0_8_;
      auVar47._0_16_ = auVar7;
      auVar47._24_8_ = auStack_10d0._8_8_;
      auVar46._8_8_ = uStack_1438;
      auVar46._0_8_ = local_1440;
      auVar46._16_8_ = uStack_1430;
      auVar46._24_8_ = uStack_1428;
      auVar12 = vpcmpgtw_avx2(auVar47,auVar46);
      local_240 = local_1120._0_8_;
      uStack_238 = local_1120._8_8_;
      uStack_230 = auStack_1110._0_8_;
      uStack_228 = auStack_1110._8_8_;
      local_14e0._0_8_ = auVar15._0_8_;
      local_260 = local_14e0._0_8_;
      local_14e0._8_8_ = auVar15._8_8_;
      uStack_258 = local_14e0._8_8_;
      local_14e0._16_8_ = auVar15._16_8_;
      uStack_250 = local_14e0._16_8_;
      local_14e0._24_8_ = auVar15._24_8_;
      uStack_248 = local_14e0._24_8_;
      local_1460._0_8_ = auVar12._0_8_;
      local_280 = local_1460._0_8_;
      local_1460._8_8_ = auVar12._8_8_;
      uStack_278 = local_1460._8_8_;
      local_1460._16_8_ = auVar12._16_8_;
      uStack_270 = local_1460._16_8_;
      local_1460._24_8_ = auVar12._24_8_;
      uStack_268 = local_1460._24_8_;
      auVar57._16_8_ = auStack_1110._0_8_;
      auVar57._0_16_ = auVar5;
      auVar57._24_8_ = auStack_1110._8_8_;
      auVar11 = vpblendvb_avx2(auVar57,auVar15,auVar12);
      local_1500._0_8_ = auVar11._0_8_;
      uVar39 = local_1500._0_8_;
      local_1500._8_8_ = auVar11._8_8_;
      uVar40 = local_1500._8_8_;
      local_1500._16_8_ = auVar11._16_8_;
      uVar41 = local_1500._16_8_;
      local_1500._24_8_ = auVar11._24_8_;
      uVar42 = local_1500._24_8_;
      local_1610[(long)local_1488 * 2] = local_1500._0_8_;
      local_1610[(long)local_1488 * 2 + 1] = local_1500._8_8_;
      local_1484 = in_R8D + local_1484;
      local_1500 = auVar11;
      local_14e0 = auVar15;
      local_14c0 = auVar13;
      local_1460 = auVar12;
      local_1400 = auVar16;
      local_1380 = auVar14;
      local_1360 = local_1480._0_8_;
      uStack_1358 = local_1480._8_8_;
      auStack_1350 = auVar79;
      local_1340 = local_1470._0_8_;
      uStack_1338 = local_1470._8_8_;
      auStack_1330 = auVar79;
      local_12e0 = uVar31;
      uStack_12d8 = uVar32;
      uStack_12d0 = uVar33;
      uStack_12c8 = uVar34;
      local_12c0 = uVar25;
      uStack_12b8 = uVar28;
      uStack_12b0 = uVar29;
      uStack_12a8 = uVar30;
      local_12a0 = local_1160._0_8_;
      uStack_1298 = local_1160._8_8_;
      uStack_1290 = auStack_1150._0_8_;
      uStack_1288 = auStack_1150._8_8_;
      local_1280 = uVar27;
      uStack_1278 = uVar18;
      uStack_1270 = uVar19;
      uStack_1268 = uVar20;
      local_1240 = uVar39;
      uStack_1238 = uVar40;
      uStack_1230 = uVar41;
      uStack_1228 = uVar42;
      local_1200 = local_1480._0_8_;
      uStack_11f8 = local_1480._8_8_;
      local_11f0 = local_1470._0_8_;
      uStack_11e8 = local_1470._8_8_;
      local_fe0 = local_1470._0_8_;
      uStack_fd8 = local_1470._8_8_;
      uStack_fd0 = uVar26;
      uStack_fc8 = 0;
      local_fc0 = local_1480._0_8_;
      uStack_fb8 = local_1480._8_8_;
      uStack_fb0 = uVar26;
      uStack_fa8 = 0;
      local_fa0 = local_1440;
      uStack_f98 = uStack_1438;
      uStack_f90 = uStack_1430;
      uStack_f88 = uStack_1428;
      local_f80 = local_10e0._0_8_;
      uStack_f78 = local_10e0._8_8_;
      uStack_f70 = auStack_10d0._0_8_;
      uStack_f68 = auStack_10d0._8_8_;
      local_ed0 = pauVar69;
      local_ec0 = uVar35;
      uStack_eb8 = uVar36;
      uStack_eb0 = uVar37;
      uStack_ea8 = uVar38;
      local_e00 = local_1470._0_8_;
      uStack_df8 = local_1470._8_8_;
      uStack_df0 = uVar26;
      uStack_de8 = 0;
      local_da0 = local_1520._0_8_;
      uStack_d98 = local_1520._8_8_;
      uStack_d90 = local_1520._16_8_;
      uStack_d88 = local_1520._24_8_;
      local_d80 = uVar21;
      uStack_d78 = uVar22;
      uStack_d70 = uVar23;
      uStack_d68 = uVar24;
    }
  }
  else {
    local_aa8 = 4;
    iVar66 = 6 - in_ECX;
    in_stack_ffffffffffffe944 = 0xb << (local_12fc & 0x1f);
    local_8f4 = 0x10;
    in_stack_ffffffffffffe93c = 0x10;
    local_804 = 0x10;
    local_808 = 0x10;
    local_80c = 0x10;
    local_810 = 0x10;
    local_814 = 0x10;
    local_818 = 0x10;
    local_81c = 0x10;
    local_820 = 0x10;
    auVar75._0_16_ = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar75._0_16_ = vpinsrd_avx(auVar75._0_16_,0x10,2);
    auVar79 = vpinsrd_avx(auVar75._0_16_,0x10,3);
    auVar75._0_16_ = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar75._0_16_ = vpinsrd_avx(auVar75._0_16_,0x10,2);
    auVar2 = vpinsrd_avx(auVar75._0_16_,0x10,3);
    local_840._0_8_ = auVar79._0_8_;
    local_840._8_8_ = auVar79._8_8_;
    auStack_830._0_8_ = auVar2._0_8_;
    auStack_830._8_8_ = auVar2._8_8_;
    local_ba0 = local_840._0_8_;
    uStack_b98 = local_840._8_8_;
    uStack_b90 = auStack_830._0_8_;
    uStack_b88 = auStack_830._8_8_;
    in_stack_ffffffffffffe942 = *(ushort *)(in_RDX + (long)(int)in_stack_ffffffffffffe944 * 2);
    auVar75._0_16_ =
         vpinsrw_avx(ZEXT216(in_stack_ffffffffffffe942),(uint)in_stack_ffffffffffffe942,1);
    auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe942,2);
    auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe942,3);
    auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe942,4);
    auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe942,5);
    auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe942,6);
    auVar9 = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe942,7);
    auVar75._0_16_ =
         vpinsrw_avx(ZEXT216(in_stack_ffffffffffffe942),(uint)in_stack_ffffffffffffe942,1);
    auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe942,2);
    auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe942,3);
    auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe942,4);
    auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe942,5);
    auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe942,6);
    auVar10 = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe942,7);
    local_9e0._0_8_ = auVar9._0_8_;
    uVar26 = local_9e0._0_8_;
    local_9e0._8_8_ = auVar9._8_8_;
    uVar27 = local_9e0._8_8_;
    auStack_9d0._0_8_ = auVar10._0_8_;
    auStack_9d0._8_8_ = auVar10._8_8_;
    local_bc0 = local_9e0._0_8_;
    uStack_bb8 = local_9e0._8_8_;
    uStack_bb0 = auStack_9d0._0_8_;
    uStack_ba8 = auStack_9d0._8_8_;
    auVar75._0_16_ = vpinsrd_avx(ZEXT416(in_stack_ffffffffffffe944),in_stack_ffffffffffffe944,1);
    auVar75._0_16_ = vpinsrd_avx(auVar75._0_16_,in_stack_ffffffffffffe944,2);
    auVar75._16_16_ = vpinsrd_avx(auVar75._0_16_,in_stack_ffffffffffffe944,3);
    auVar75._0_16_ = vpinsrd_avx(ZEXT416(in_stack_ffffffffffffe944),in_stack_ffffffffffffe944,1);
    auVar75._0_16_ = vpinsrd_avx(auVar75._0_16_,in_stack_ffffffffffffe944,2);
    auVar75._0_16_ = vpinsrd_avx(auVar75._0_16_,in_stack_ffffffffffffe944,3);
    auVar75._0_16_ = ZEXT116(0) * auVar75._16_16_ + ZEXT116(1) * auVar75._0_16_;
    auVar75._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar75._16_16_;
    local_800._16_8_ = auVar75._16_8_;
    local_800._24_8_ = auVar75._24_8_;
    local_c44 = in_R8D;
    local_9e0 = auVar9;
    for (local_c48 = 0; auVar3 = local_1160, auVar4 = auStack_1150, auVar5 = local_1120,
        auVar6 = auStack_1110, auVar7 = local_10e0, auVar8 = auStack_10d0, auVar14 = local_10a0,
        local_ac8 = in_stack_ffffffffffffe944, local_ac4 = iVar66, local_ab0 = local_1610,
        local_aa2 = in_stack_ffffffffffffe942, local_9c0 = in_stack_ffffffffffffe942,
        local_9be = in_stack_ffffffffffffe942, local_9bc = in_stack_ffffffffffffe942,
        local_9ba = in_stack_ffffffffffffe942, local_9b8 = in_stack_ffffffffffffe942,
        local_9b6 = in_stack_ffffffffffffe942, local_9b4 = in_stack_ffffffffffffe942,
        local_9b2 = in_stack_ffffffffffffe942, local_9b0 = in_stack_ffffffffffffe942,
        local_9ae = in_stack_ffffffffffffe942, local_9ac = in_stack_ffffffffffffe942,
        local_9aa = in_stack_ffffffffffffe942, local_9a8 = in_stack_ffffffffffffe942,
        local_9a6 = in_stack_ffffffffffffe942, local_9a4 = in_stack_ffffffffffffe942,
        local_9a2 = in_stack_ffffffffffffe942, local_8f8 = in_stack_ffffffffffffe944,
        auVar11 = auVar75, local_7e0 = in_stack_ffffffffffffe944,
        local_7dc = in_stack_ffffffffffffe944, local_7d8 = in_stack_ffffffffffffe944,
        local_7d4 = in_stack_ffffffffffffe944, local_7d0 = in_stack_ffffffffffffe944,
        local_7cc = in_stack_ffffffffffffe944, local_7c8 = in_stack_ffffffffffffe944,
        local_7c4 = in_stack_ffffffffffffe944, local_c48 < 4; local_c48 = local_c48 + 1) {
      uVar67 = (int)local_c44 >> ((byte)iVar66 & 0x1f);
      local_ce4 = uVar67;
      if ((int)in_stack_ffffffffffffe944 <= (int)uVar67) {
        for (local_ce8 = local_c48; local_ce8 < 4; local_ce8 = local_ce8 + 1) {
          local_1610[(long)local_ce8 * 2] = uVar26;
          local_1610[(long)local_ce8 * 2 + 1] = uVar27;
          local_a40 = uVar26;
          uStack_a38 = uVar27;
          uStack_a30 = auStack_9d0._0_8_;
          uStack_a28 = auStack_9d0._8_8_;
        }
        break;
      }
      pauVar69 = (undefined1 (*) [16])(in_RDX + (long)(int)uVar67 * 2);
      uVar18 = *(undefined8 *)*pauVar69;
      uVar19 = *(undefined8 *)(*pauVar69 + 8);
      auVar14 = vpmovzxwd_avx2(*pauVar69);
      lVar70 = in_RDX + (long)(int)uVar67 * 2;
      pauVar71 = (undefined1 (*) [16])(lVar70 + 2);
      uVar20 = *(undefined8 *)*pauVar71;
      uVar21 = *(undefined8 *)(lVar70 + 10);
      local_b20 = vpmovzxwd_avx2(*pauVar71);
      if (in_ECX == 0) {
        local_168 = uVar67 + 1;
        local_16c = uVar67 + 2;
        local_170 = uVar67 + 3;
        local_174 = uVar67 + 4;
        local_178 = uVar67 + 5;
        local_17c = uVar67 + 6;
        local_180 = uVar67 + 7;
        auVar78._0_16_ = vpinsrd_avx(ZEXT416(uVar67),local_168,1);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,local_16c,2);
        local_160 = vpinsrd_avx(auVar78._0_16_,local_170,3);
        auVar78._0_16_ = vpinsrd_avx(ZEXT416(local_174),local_178,1);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,local_17c,2);
        auStack_150 = vpinsrd_avx(auVar78._0_16_,local_180,3);
        local_c20 = local_160._0_8_;
        uStack_c18 = local_160._8_8_;
        uStack_c10 = auStack_150._0_8_;
        uStack_c08 = auStack_150._8_8_;
        local_904 = local_c44;
        local_704 = local_c44;
        local_708 = local_c44;
        local_70c = local_c44;
        local_710 = local_c44;
        local_714 = local_c44;
        local_718 = local_c44;
        local_71c = local_c44;
        local_720 = local_c44;
        auVar78._0_16_ = vpinsrd_avx(ZEXT416(local_c44),local_c44,1);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,local_c44,2);
        local_740 = vpinsrd_avx(auVar78._0_16_,local_c44,3);
        auVar78._0_16_ = vpinsrd_avx(ZEXT416(local_c44),local_c44,1);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,local_c44,2);
        auStack_730 = vpinsrd_avx(auVar78._0_16_,local_c44,3);
        local_908 = 0x3f;
        in_stack_ffffffffffffe92c = 0x3f;
        local_6c4 = 0x3f;
        local_6c8 = 0x3f;
        local_6cc = 0x3f;
        local_6d0 = 0x3f;
        local_6d4 = 0x3f;
        local_6d8 = 0x3f;
        local_6dc = 0x3f;
        local_6e0 = 0x3f;
        auVar78._0_16_ = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,0x3f,2);
        auVar78._16_16_ = vpinsrd_avx(auVar78._0_16_,0x3f,3);
        auVar78._0_16_ = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,0x3f,2);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,0x3f,3);
        auVar78._0_16_ = ZEXT116(0) * auVar78._16_16_ + ZEXT116(1) * auVar78._0_16_;
        auVar78._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar78._16_16_;
        local_700._16_8_ = auVar78._16_8_;
        local_700._24_8_ = auVar78._24_8_;
        local_980 = local_740._0_8_;
        uStack_978 = local_740._8_8_;
        uStack_970 = auStack_730._0_8_;
        uStack_968 = auStack_730._8_8_;
        auVar12._16_8_ = auStack_730._0_8_;
        auVar12._0_16_ = local_740;
        auVar12._24_8_ = auStack_730._8_8_;
        auVar11._16_8_ = local_700._16_8_;
        auVar11._0_16_ = auVar78._0_16_;
        auVar11._24_8_ = local_700._24_8_;
        local_5e0 = vpand_avx2(auVar12,auVar11);
        local_5e4 = 1;
        local_ce0 = vpsrld_avx2(local_5e0,ZEXT416(1));
        in_stack_ffffffffffffe928 = local_c44;
        _local_b00 = auVar14;
        local_700 = auVar78;
        local_164 = uVar67;
        local_140 = uVar67;
        local_13c = local_168;
        local_138 = local_16c;
        local_134 = local_170;
        local_130 = local_174;
        local_12c = local_178;
        local_128 = local_17c;
        local_124 = local_180;
      }
      else {
        local_b00._0_8_ = auVar14._0_8_;
        local_b00._8_8_ = auVar14._8_8_;
        local_b00._16_8_ = auVar14._16_8_;
        uStack_ae8 = auVar14._24_8_;
        local_628 = 7;
        local_62c = 5;
        local_630 = 3;
        local_634 = 1;
        local_638 = 6;
        local_63c = 4;
        local_640 = 2;
        local_644 = 0;
        auVar77._0_16_ = vpinsrd_avx(ZEXT416(0),2,1);
        auVar77._0_16_ = vpinsrd_avx(auVar77._0_16_,4,2);
        local_680 = vpinsrd_avx(auVar77._0_16_,6,3);
        auVar77._0_16_ = vpinsrd_avx(ZEXT416(1),3,1);
        auVar77._0_16_ = vpinsrd_avx(auVar77._0_16_,5,2);
        auStack_670 = vpinsrd_avx(auVar77._0_16_,7,3);
        local_860 = local_b00._0_8_;
        uStack_858 = local_b00._8_8_;
        uStack_850 = local_b00._16_8_;
        uStack_848 = uStack_ae8;
        local_880 = local_680._0_8_;
        uStack_878 = local_680._8_8_;
        uStack_870 = auStack_670._0_8_;
        uStack_868 = auStack_670._8_8_;
        auVar15._16_8_ = auStack_670._0_8_;
        auVar15._0_16_ = local_680;
        auVar15._24_8_ = auStack_670._8_8_;
        auVar11 = vpermd_avx2(auVar15,auVar14);
        stack0xfffffffffffff510 = auVar11._16_16_;
        local_9e0 = stack0xfffffffffffff510;
        auStack_b50 = auVar14._0_16_;
        local_b20._8_8_ = uStack_9e8;
        local_b20._0_8_ = local_9f0;
        local_920 = (undefined1 (*) [16])(in_RDX + 0x10 + (long)(int)uVar67 * 2);
        local_8f0 = *(undefined8 *)*local_920;
        uStack_8e8 = *(undefined8 *)(*local_920 + 8);
        auVar14 = vpmovzxwd_avx2(*local_920);
        local_b40._0_8_ = auVar14._0_8_;
        local_b40._8_8_ = auVar14._8_8_;
        local_b40._16_8_ = auVar14._16_8_;
        local_b40._24_8_ = auVar14._24_8_;
        local_684 = 7;
        local_688 = 5;
        local_68c = 3;
        local_690 = 1;
        local_694 = 6;
        local_698 = 4;
        local_69c = 2;
        local_6a0 = 0;
        auVar77._0_16_ = vpinsrd_avx(ZEXT416(0),2,1);
        auVar77._0_16_ = vpinsrd_avx(auVar77._0_16_,4,2);
        local_6c0 = vpinsrd_avx(auVar77._0_16_,6,3);
        auVar77._0_16_ = vpinsrd_avx(ZEXT416(1),3,1);
        auVar77._0_16_ = vpinsrd_avx(auVar77._0_16_,5,2);
        auStack_6b0 = vpinsrd_avx(auVar77._0_16_,7,3);
        local_8a0 = local_b40._0_8_;
        uStack_898 = local_b40._8_8_;
        uStack_890 = local_b40._16_8_;
        uStack_888 = local_b40._24_8_;
        local_8c0 = local_6c0._0_8_;
        uStack_8b8 = local_6c0._8_8_;
        uStack_8b0 = auStack_6b0._0_8_;
        uStack_8a8 = auStack_6b0._8_8_;
        auVar13._16_8_ = auStack_6b0._0_8_;
        auVar13._0_16_ = local_6c0;
        auVar13._24_8_ = auStack_6b0._8_8_;
        local_b40 = vpermd_avx2(auVar13,auVar14);
        uStack_9e8 = local_b40._24_8_;
        local_9f0 = local_b40._16_8_;
        local_a60 = local_b40._0_8_;
        uStack_a58 = local_b40._8_8_;
        uStack_a50 = local_b40._16_8_;
        uStack_a48 = local_b40._24_8_;
        auVar76._0_16_ = ZEXT116(0) * local_b40._0_16_ + ZEXT116(1) * auVar11._0_16_;
        auVar76._16_16_ = ZEXT116(0) * stack0xfffffffffffff510 + ZEXT116(1) * local_b40._0_16_;
        uStack_a70 = local_b00._0_8_;
        uStack_a68 = local_b00._8_8_;
        auVar3._8_8_ = uStack_9f8;
        auVar3._0_8_ = local_a00;
        local_b20._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * local_b20._0_16_;
        local_b20._16_16_ = ZEXT116(0) * auStack_b50 + ZEXT116(1) * auVar3;
        local_1c8 = uVar67 + 2;
        local_1cc = uVar67 + 4;
        local_1d0 = uVar67 + 6;
        local_1d4 = uVar67 + 8;
        local_1d8 = uVar67 + 10;
        local_1dc = uVar67 + 0xc;
        local_1e0 = uVar67 + 0xe;
        auVar77._0_16_ = vpinsrd_avx(ZEXT416(uVar67),local_1c8,1);
        auVar77._0_16_ = vpinsrd_avx(auVar77._0_16_,local_1cc,2);
        local_1c0 = vpinsrd_avx(auVar77._0_16_,local_1d0,3);
        auVar77._0_16_ = vpinsrd_avx(ZEXT416(local_1d4),local_1d8,1);
        auVar77._0_16_ = vpinsrd_avx(auVar77._0_16_,local_1dc,2);
        auStack_1b0 = vpinsrd_avx(auVar77._0_16_,local_1e0,3);
        local_c20 = local_1c0._0_8_;
        uStack_c18 = local_1c0._8_8_;
        uStack_c10 = auStack_1b0._0_8_;
        uStack_c08 = auStack_1b0._8_8_;
        local_8fc = local_c44;
        local_784 = local_c44;
        local_788 = local_c44;
        local_78c = local_c44;
        local_790 = local_c44;
        local_794 = local_c44;
        local_798 = local_c44;
        local_79c = local_c44;
        local_7a0 = local_c44;
        auVar77._0_16_ = vpinsrd_avx(ZEXT416(local_c44),local_c44,1);
        auVar77._0_16_ = vpinsrd_avx(auVar77._0_16_,local_c44,2);
        local_7c0 = vpinsrd_avx(auVar77._0_16_,local_c44,3);
        auVar77._0_16_ = vpinsrd_avx(ZEXT416(local_c44),local_c44,1);
        auVar77._0_16_ = vpinsrd_avx(auVar77._0_16_,local_c44,2);
        auStack_7b0 = vpinsrd_avx(auVar77._0_16_,local_c44,3);
        local_520 = local_7c0._0_8_;
        uStack_518 = local_7c0._8_8_;
        uStack_510 = auStack_7b0._0_8_;
        uStack_508 = auStack_7b0._8_8_;
        auVar16._16_8_ = auStack_7b0._0_8_;
        auVar16._0_16_ = local_7c0;
        auVar16._24_8_ = auStack_7b0._8_8_;
        local_940 = vpslld_avx2(auVar16,ZEXT416(in_ECX));
        local_900 = 0x3f;
        in_stack_ffffffffffffe938 = 0x3f;
        local_744 = 0x3f;
        local_748 = 0x3f;
        local_74c = 0x3f;
        local_750 = 0x3f;
        local_754 = 0x3f;
        local_758 = 0x3f;
        local_75c = 0x3f;
        local_760 = 0x3f;
        auVar77._0_16_ = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar77._0_16_ = vpinsrd_avx(auVar77._0_16_,0x3f,2);
        auVar77._16_16_ = vpinsrd_avx(auVar77._0_16_,0x3f,3);
        auVar77._0_16_ = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar77._0_16_ = vpinsrd_avx(auVar77._0_16_,0x3f,2);
        auVar77._0_16_ = vpinsrd_avx(auVar77._0_16_,0x3f,3);
        auVar77._0_16_ = ZEXT116(0) * auVar77._16_16_ + ZEXT116(1) * auVar77._0_16_;
        auVar77._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar77._16_16_;
        local_780._16_8_ = auVar77._16_8_;
        local_780._24_8_ = auVar77._24_8_;
        auVar14._16_8_ = local_780._16_8_;
        auVar14._0_16_ = auVar77._0_16_;
        auVar14._24_8_ = local_780._24_8_;
        local_5a0 = vpand_avx2(local_940,auVar14);
        local_5a4 = 1;
        local_ce0 = vpsrld_avx2(local_5a0,ZEXT416(1));
        in_stack_ffffffffffffe930 = uVar67;
        in_stack_ffffffffffffe934 = local_c44;
        _local_b00 = auVar76;
        local_780 = auVar77;
        local_1c4 = uVar67;
        local_1a0 = uVar67;
        local_19c = local_1c8;
        local_198 = local_1cc;
        local_194 = local_1d0;
        local_190 = local_1d4;
        local_18c = local_1d8;
        local_188 = local_1dc;
        local_184 = local_1e0;
      }
      local_4e0 = local_b20._0_8_;
      uStack_4d8 = local_b20._8_8_;
      uStack_4d0 = local_b20._16_8_;
      uStack_4c8 = local_b20._24_8_;
      local_500 = local_b00._0_8_;
      uStack_4f8 = local_b00._8_8_;
      uStack_4f0 = local_b00._16_8_;
      uStack_4e8 = uStack_ae8;
      auVar16 = vpsubd_avx2(local_b20,_local_b00);
      local_560 = local_b00._0_8_;
      uStack_558 = local_b00._8_8_;
      uStack_550 = local_b00._16_8_;
      uStack_548 = uStack_ae8;
      local_564 = 5;
      auVar14 = vpslld_avx2(_local_b00,ZEXT416(5));
      local_b80._0_8_ = auVar14._0_8_;
      local_460 = local_b80._0_8_;
      local_b80._8_8_ = auVar14._8_8_;
      uStack_458 = local_b80._8_8_;
      local_b80._16_8_ = auVar14._16_8_;
      uStack_450 = local_b80._16_8_;
      local_b80._24_8_ = auVar14._24_8_;
      uStack_448 = local_b80._24_8_;
      local_480 = local_840._0_8_;
      uStack_478 = local_840._8_8_;
      uStack_470 = auStack_830._0_8_;
      uStack_468 = auStack_830._8_8_;
      auVar53._16_8_ = auStack_830._0_8_;
      auVar53._0_16_ = auVar79;
      auVar53._24_8_ = auStack_830._8_8_;
      auVar12 = vpaddd_avx2(auVar14,auVar53);
      local_be0._0_8_ = auVar16._0_8_;
      local_420 = local_be0._0_8_;
      local_be0._8_8_ = auVar16._8_8_;
      uStack_418 = local_be0._8_8_;
      local_be0._16_8_ = auVar16._16_8_;
      uStack_410 = local_be0._16_8_;
      local_be0._24_8_ = auVar16._24_8_;
      uStack_408 = local_be0._24_8_;
      local_440 = local_ce0._0_8_;
      uStack_438 = local_ce0._8_8_;
      uStack_430 = local_ce0._16_8_;
      uStack_428 = local_ce0._24_8_;
      auVar13 = vpmulld_avx2(auVar16,local_ce0);
      local_b80._0_8_ = auVar12._0_8_;
      local_4a0 = local_b80._0_8_;
      local_b80._8_8_ = auVar12._8_8_;
      uStack_498 = local_b80._8_8_;
      local_b80._16_8_ = auVar12._16_8_;
      uStack_490 = local_b80._16_8_;
      local_b80._24_8_ = auVar12._24_8_;
      uStack_488 = local_b80._24_8_;
      local_c80._0_8_ = auVar13._0_8_;
      local_4c0 = local_c80._0_8_;
      local_c80._8_8_ = auVar13._8_8_;
      uStack_4b8 = local_c80._8_8_;
      local_c80._16_8_ = auVar13._16_8_;
      uStack_4b0 = local_c80._16_8_;
      local_c80._24_8_ = auVar13._24_8_;
      uStack_4a8 = local_c80._24_8_;
      auVar14 = vpaddd_avx2(auVar12,auVar13);
      local_ca0._0_8_ = auVar14._0_8_;
      uVar28 = local_ca0._0_8_;
      local_ca0._8_8_ = auVar14._8_8_;
      uVar29 = local_ca0._8_8_;
      local_ca0._16_8_ = auVar14._16_8_;
      uVar30 = local_ca0._16_8_;
      local_ca0._24_8_ = auVar14._24_8_;
      uStack_608 = local_ca0._24_8_;
      local_624 = 5;
      auStack_110 = ZEXT416(5);
      auVar15 = vpsrld_avx2(auVar14,auStack_110);
      local_ca0._0_8_ = auVar15._0_8_;
      local_100 = local_ca0._0_8_;
      local_ca0._8_8_ = auVar15._8_8_;
      uStack_f8 = local_ca0._8_8_;
      local_ca0._16_8_ = auVar15._16_8_;
      uStack_f0 = local_ca0._16_8_;
      local_ca0._24_8_ = auVar15._24_8_;
      uStack_e8 = local_ca0._24_8_;
      uVar22 = local_ca0._16_8_;
      uVar23 = local_ca0._24_8_;
      local_120 = local_ca0._16_8_;
      uStack_118 = local_ca0._24_8_;
      auVar58._16_16_ = auStack_110;
      auVar58._0_16_ = auVar15._16_16_;
      auVar11 = vpackusdw_avx2(auVar15,auVar58);
      uStack_b0 = local_800._16_8_;
      uStack_a8 = local_800._24_8_;
      local_e0 = local_c20;
      uStack_d8 = uStack_c18;
      uStack_d0 = uStack_c10;
      uStack_c8 = uStack_c08;
      auVar60._16_8_ = local_800._16_8_;
      auVar60._0_16_ = auVar75._0_16_;
      auVar60._24_8_ = local_800._24_8_;
      auVar59._8_8_ = uStack_c18;
      auVar59._0_8_ = local_c20;
      auVar59._16_8_ = uStack_c10;
      auVar59._24_8_ = uStack_c08;
      auVar14 = vpcmpgtd_avx2(auVar60,auVar59);
      local_c40._0_8_ = auVar14._0_8_;
      local_80 = local_c40._0_8_;
      local_c40._8_8_ = auVar14._8_8_;
      uStack_78 = local_c40._8_8_;
      local_c40._16_8_ = auVar14._16_8_;
      uStack_70 = local_c40._16_8_;
      local_c40._24_8_ = auVar14._24_8_;
      uStack_68 = local_c40._24_8_;
      uVar24 = local_c40._16_8_;
      uVar25 = local_c40._24_8_;
      local_a0 = local_c40._16_8_;
      uStack_98 = local_c40._24_8_;
      auStack_90 = ZEXT416(5);
      auVar61._16_16_ = auStack_90;
      auVar61._0_16_ = auVar14._16_16_;
      auVar14 = vpackssdw_avx2(auVar14,auVar61);
      local_2a0 = uVar26;
      uStack_298 = uVar27;
      uStack_290 = auStack_9d0._0_8_;
      uStack_288 = auStack_9d0._8_8_;
      local_cc0._0_8_ = auVar11._0_8_;
      local_2c0 = local_cc0._0_8_;
      local_cc0._8_8_ = auVar11._8_8_;
      uStack_2b8 = local_cc0._8_8_;
      local_cc0._16_8_ = auVar11._16_8_;
      uStack_2b0 = local_cc0._16_8_;
      local_cc0._24_8_ = auVar11._24_8_;
      uStack_2a8 = local_cc0._24_8_;
      local_c40._0_8_ = auVar14._0_8_;
      local_2e0 = local_c40._0_8_;
      local_c40._8_8_ = auVar14._8_8_;
      uStack_2d8 = local_c40._8_8_;
      local_c40._16_8_ = auVar14._16_8_;
      uStack_2d0 = local_c40._16_8_;
      local_c40._24_8_ = auVar14._24_8_;
      uStack_2c8 = local_c40._24_8_;
      auVar56._16_8_ = auStack_9d0._0_8_;
      auVar56._0_16_ = auVar9;
      auVar56._24_8_ = auStack_9d0._8_8_;
      auVar11 = vpblendvb_avx2(auVar56,auVar11,auVar14);
      local_cc0._0_8_ = auVar11._0_8_;
      uVar31 = local_cc0._0_8_;
      local_cc0._8_8_ = auVar11._8_8_;
      uVar32 = local_cc0._8_8_;
      local_cc0._16_8_ = auVar11._16_8_;
      uVar33 = local_cc0._16_8_;
      local_cc0._24_8_ = auVar11._24_8_;
      uVar34 = local_cc0._24_8_;
      local_1610[(long)local_c48 * 2] = local_cc0._0_8_;
      local_1610[(long)local_c48 * 2 + 1] = local_cc0._8_8_;
      local_c44 = in_R8D + local_c44;
      local_cc0 = auVar11;
      local_ca0 = auVar15;
      local_c80 = auVar13;
      local_c40 = auVar14;
      local_be0 = auVar16;
      local_b80 = auVar12;
      local_aa0 = uVar31;
      uStack_a98 = uVar32;
      uStack_a90 = uVar33;
      uStack_a88 = uVar34;
      local_a20 = uVar24;
      uStack_a18 = uVar25;
      local_a10 = uVar22;
      uStack_a08 = uVar23;
      local_918 = pauVar71;
      local_910 = pauVar69;
      local_8e0 = uVar20;
      uStack_8d8 = uVar21;
      local_8d0 = uVar18;
      uStack_8c8 = uVar19;
      local_620 = uVar28;
      uStack_618 = uVar29;
      uStack_610 = uVar30;
      local_c0 = auVar75._0_16_;
    }
  }
  local_800 = auVar11;
  auStack_830 = auVar2;
  local_840 = auVar79;
  auStack_9d0 = auVar10;
  local_10a0 = auVar14;
  auStack_10d0 = auVar8;
  local_10e0 = auVar7;
  auStack_1110 = auVar6;
  local_1120 = auVar5;
  auStack_1150 = auVar4;
  local_1160 = auVar3;
  local_15b0 = in_RSI;
  local_15a8 = in_RDI;
  local_13c0 = auVar72._0_16_;
  auStack_13b0 = auVar72._16_16_;
  local_c00 = auVar75._0_16_;
  auStack_bf0 = auVar75._16_16_;
  local_f40 = auVar74._0_16_;
  auStack_f30 = auVar74._16_16_;
  local_dc0 = auVar73._0_16_;
  auStack_db0 = auVar73._16_16_;
  local_9a0 = auVar78._0_16_;
  auStack_990 = auVar78._16_16_;
  local_960 = auVar77._0_16_;
  auStack_950 = auVar77._16_16_;
  local_f20 = auVar62;
  auStack_f10 = auVar63;
  local_f60 = auVar64;
  auStack_f50 = auVar65;
  highbd_transpose4x8_8x4_sse2
            (in_stack_ffffffffffffe918,in_stack_ffffffffffffe910,(__m128i *)(local_1690 + 0xe),
             (__m128i *)(local_1690 + 0xc),(__m128i *)(local_1690 + 10),(__m128i *)(local_1690 + 8),
             (__m128i *)CONCAT44(in_stack_ffffffffffffe92c,in_stack_ffffffffffffe928),
             (__m128i *)CONCAT44(in_stack_ffffffffffffe934,in_stack_ffffffffffffe930),
             (__m128i *)CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938),
             (__m128i *)
             CONCAT44(in_stack_ffffffffffffe944,
                      CONCAT22(in_stack_ffffffffffffe942,in_stack_ffffffffffffe940)),
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffe94e,
                      CONCAT24(in_stack_ffffffffffffe94c,in_stack_ffffffffffffe948)),
             (__m128i *)
             CONCAT17(in_stack_ffffffffffffe957,
                      CONCAT16(in_stack_ffffffffffffe956,
                               CONCAT24(in_stack_ffffffffffffe954,
                                        CONCAT22(in_stack_ffffffffffffe952,in_stack_ffffffffffffe950
                                                )))));
  for (local_1694 = 0; local_1694 < 8; local_1694 = local_1694 + 1) {
    *(longlong *)(local_15a8 + local_1694 * local_15b0 * 2) = local_1690[(long)local_1694 * 2];
  }
  return;
}

Assistant:

static void highbd_dr_prediction_z3_4x8_avx2(uint16_t *dst, ptrdiff_t stride,
                                             const uint16_t *left,
                                             int upsample_left, int dy,
                                             int bd) {
  __m128i dstvec[4], d[8];
  if (bd < 12) {
    highbd_dr_prediction_z1_8xN_internal_avx2(4, dstvec, left, upsample_left,
                                              dy);
  } else {
    highbd_dr_prediction_32bit_z1_8xN_internal_avx2(4, dstvec, left,
                                                    upsample_left, dy);
  }

  highbd_transpose4x8_8x4_sse2(&dstvec[0], &dstvec[1], &dstvec[2], &dstvec[3],
                               &d[0], &d[1], &d[2], &d[3], &d[4], &d[5], &d[6],
                               &d[7]);
  for (int i = 0; i < 8; i++) {
    _mm_storel_epi64((__m128i *)(dst + i * stride), d[i]);
  }
}